

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O2

void __thiscall Chip8::OP_FX33(Chip8 *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"LD B");
  poVar1 = std::operator<<(poVar1,", V");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,
                           "                  ; Store BCD representation of Vx in memory locations I, I+1, and I+2."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Chip8::OP_FX33() {
    std::cout << "LD B" << ", V"<<((opcode & 0x0F00u) >> 8u) << "                  ; Store BCD representation of Vx in memory locations I, I+1, and I+2." << std::endl;
}